

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall despot::Parser::PrintAction(Parser *this,ACT_TYPE action,ostream *out)

{
  long lVar1;
  ostream *poVar2;
  
  poVar2 = (ostream *)std::ostream::operator<<(out,action);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  lVar1 = *(long *)&(((this->action_vars_).
                      super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
                      _M_impl.super__Vector_impl_data._M_start)->super_Variable).values_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,*(char **)(lVar1 + (long)action * 0x20),
                      *(long *)(lVar1 + 8 + (long)action * 0x20));
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void Parser::PrintAction(ACT_TYPE action, ostream& out) const {
	out << action << ":" << action_vars_[0].GetValue(action) << endl;
}